

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression * build_ir_convert(Context_conflict *ctx,MOJOSHADER_astExpressionCast *ast)

{
  MOJOSHADER_astDataTypeType type_00;
  int elements;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_irExpression *pMVar2;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astExpressionCast *ast_local;
  Context_conflict *ctx_local;
  
  dt_00 = reduce_datatype(ctx,ast->datatype);
  pMVar1 = datatype_base(ctx,dt_00);
  type_00 = pMVar1->type;
  elements = datatype_elems(ctx,dt_00);
  pMVar2 = build_ir_expr(ctx,ast->operand);
  pMVar2 = new_ir_convert(ctx,pMVar2,type_00,elements);
  return pMVar2;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_convert(Context *ctx, const MOJOSHADER_astExpressionCast *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_convert(ctx, build_ir_expr(ctx, ast->operand), type, elems);
}